

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall llbuild::buildsystem::BuildSystem::build(BuildSystem *this,StringRef name)

{
  BuildSystemImpl *this_00;
  BuildDescription *pBVar1;
  Child LHS;
  Child CVar2;
  char cVar3;
  int iVar4;
  _func_int **pp_Var5;
  Child *pCVar6;
  size_type sVar7;
  size_type sVar8;
  _Alloc_hider _Var9;
  pointer pcVar10;
  BuildSystemDelegate *pBVar11;
  Child RHS;
  StringRef Key;
  StringRef str;
  StringRef local_100;
  Child local_f0;
  undefined4 uStack_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  uint local_d0;
  undefined4 uStack_cc;
  NodeKind local_c0;
  char cStack_bf;
  undefined6 uStack_be;
  Child local_b8 [2];
  undefined8 local_a8;
  char local_48;
  Child local_38;
  undefined4 local_30;
  
  sVar7 = name.Length;
  _Var9._M_p = name.Data;
  this_00 = (BuildSystemImpl *)this->impl;
  pBVar1 = (this_00->buildDescription)._M_t.
           super___uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
           .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl;
  if (pBVar1 == (BuildDescription *)0x0) {
    pcVar10 = (this_00->mainFilename)._M_dataplus._M_p;
    sVar8 = (this_00->mainFilename)._M_string_length;
    local_100.Data = _Var9._M_p;
    local_100.Length = sVar7;
    llvm::Twine::Twine((Twine *)local_b8,"no build description loaded");
    pBVar11 = this_00->delegate;
    pCVar6 = &local_f0;
    local_f0.twine = (Twine *)0x0;
    uStack_e8 = 0;
    pp_Var5 = pBVar11->_vptr_BuildSystemDelegate;
  }
  else {
    if (sVar7 == 0) {
      _Var9._M_p = (pBVar1->defaultTarget)._M_dataplus._M_p;
      sVar7 = (pBVar1->defaultTarget)._M_string_length;
    }
    Key.Length = sVar7;
    Key.Data = _Var9._M_p;
    local_100.Data = _Var9._M_p;
    local_100.Length = sVar7;
    iVar4 = llvm::StringMapImpl::FindKey(&(pBVar1->targets).super_StringMapImpl,Key);
    if ((iVar4 != -1) && ((long)iVar4 != (ulong)(pBVar1->targets).super_StringMapImpl.NumBuckets)) {
      str.Length = sVar7;
      str.Data = _Var9._M_p;
      BuildKey::BuildKey((BuildKey *)&local_f0,'T',str);
      anon_unknown.dwarf_6d004::BuildSystemImpl::build
                ((Optional<llbuild::buildsystem::BuildValue> *)local_b8,this_00,
                 (BuildKey *)&local_f0);
      cVar3 = local_48;
      if (local_48 == '\x01') {
        BuildValue::~BuildValue((BuildValue *)local_b8);
        local_48 = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.twine == &local_e0) {
        return (bool)cVar3;
      }
      operator_delete(local_f0.twine,
                      CONCAT62(local_e0._M_allocated_capacity._2_6_,
                               CONCAT11(local_e0._M_local_buf[1],local_e0._M_local_buf[0])) + 1);
      return (bool)cVar3;
    }
    pcVar10 = (this_00->mainFilename)._M_dataplus._M_p;
    sVar8 = (this_00->mainFilename)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_f0,"No target named \'",&local_100);
    llvm::Twine::Twine((Twine *)&local_d0,"\' in build description");
    if ((local_e0._M_local_buf[0] == NullKind) || (local_c0 == NullKind)) {
      local_a8 = CONCAT62(local_a8._2_6_,0x100);
    }
    else if (local_e0._M_local_buf[0] == EmptyKind) {
      local_a8 = CONCAT62(uStack_be,CONCAT11(cStack_bf,local_c0));
      local_b8[0]._0_4_ = local_d0;
      local_b8[0]._4_4_ = uStack_cc;
    }
    else if (local_c0 == EmptyKind) {
      local_a8 = CONCAT62(local_e0._M_allocated_capacity._2_6_,
                          CONCAT11(local_e0._M_local_buf[1],local_e0._M_local_buf[0]));
      local_b8[0].decUI = local_f0.decUI;
      local_b8[0]._4_4_ = local_f0._4_4_;
    }
    else {
      LHS = local_f0;
      if (local_e0._M_local_buf[1] != '\x01') {
        local_e0._M_local_buf[0] = TwineKind;
        LHS.twine = (Twine *)&local_f0;
      }
      if (cStack_bf != '\x01') {
        local_c0 = TwineKind;
      }
      CVar2._4_4_ = uStack_cc;
      CVar2.decUI = local_d0;
      RHS.twine = (Twine *)&local_d0;
      if (cStack_bf == '\x01') {
        RHS = CVar2;
      }
      llvm::Twine::Twine((Twine *)local_b8,LHS,local_e0._M_local_buf[0],RHS,local_c0);
    }
    pBVar11 = this_00->delegate;
    pCVar6 = &local_38;
    local_38.twine = (Twine *)0x0;
    local_30 = 0;
    pp_Var5 = pBVar11->_vptr_BuildSystemDelegate;
  }
  (*pp_Var5[3])(pBVar11,pcVar10,sVar8,pCVar6,local_b8);
  return false;
}

Assistant:

bool BuildSystem::build(StringRef name) {
  return static_cast<BuildSystemImpl*>(impl)->build(name);
}